

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::parseVcstParameter(MipsParser *this,Parser *parser,int *result)

{
  bool bVar1;
  int iVar2;
  TokenType TVar3;
  undefined4 uVar4;
  TokenType TVar5;
  TokenSequence tokens;
  TokenSequence tokens_00;
  TokenSequence tokens_01;
  TokenSequence tokens_02;
  TokenSequence tokens_03;
  TokenSequence tokens_04;
  TokenSequence tokens_05;
  TokenSequence tokens_06;
  TokenSequence tokens_07;
  TokenSequence tokens_08;
  TokenSequence tokens_09;
  TokenSequence tokens_10;
  TokenSequence tokens_11;
  TokenSequence tokens_12;
  TokenSequence tokens_13;
  TokenSequence tokens_14;
  TokenSequence tokens_15;
  TokenSequence tokens_16;
  TokenSequence tokens_17;
  TokenSequence tokens_18;
  TokenValueSequence values;
  TokenValueSequence values_00;
  TokenValueSequence values_01;
  TokenValueSequence values_02;
  TokenValueSequence values_03;
  TokenValueSequence values_04;
  TokenValueSequence values_05;
  TokenValueSequence values_06;
  TokenValueSequence values_07;
  TokenValueSequence values_08;
  TokenValueSequence values_09;
  TokenValueSequence values_10;
  TokenValueSequence values_11;
  TokenValueSequence values_12;
  TokenValueSequence values_13;
  TokenValueSequence values_14;
  TokenValueSequence values_15;
  TokenValueSequence values_16;
  TokenValueSequence values_17;
  TokenValueSequence values_18;
  TokenType local_88 [6];
  TokenSequenceValue local_70;
  TokenType local_60;
  char *local_58;
  TokenType local_50;
  char *local_48;
  Parser *local_40;
  int *local_38;
  
  if (parseVcstParameter(Parser&,int&)::sequenceParser == '\0') {
    iVar2 = __cxa_guard_acquire(&parseVcstParameter(Parser&,int&)::sequenceParser);
    if (iVar2 != 0) {
      parseVcstParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parseVcstParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parseVcstParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(TokenSequenceParser::~TokenSequenceParser,&parseVcstParameter::sequenceParser,
                   &__dso_handle);
      __cxa_guard_release(&parseVcstParameter(Parser&,int&)::sequenceParser);
    }
  }
  if (parseVcstParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      parseVcstParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    TVar3 = Identifier;
    local_88[0] = 1;
    local_70.field_1.textValue = "maxfloat";
    tokens._M_len = 1;
    tokens._M_array = local_88;
    values._M_len = 1;
    values._M_array = &local_70;
    local_70.type = TVar3;
    local_40 = parser;
    local_38 = result;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,1,tokens,values);
    local_88[0] = Identifier;
    local_88[1] = LParen;
    local_88[2] = Integer;
    local_88[3] = RParen;
    local_70.field_1.textValue = "sqrt";
    uVar4 = 2;
    local_58 = (char *)0x2;
    tokens_00._M_len = 4;
    tokens_00._M_array = local_88;
    values_00._M_len = 2;
    values_00._M_array = &local_70;
    local_70.type = TVar3;
    local_60 = uVar4;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,2,tokens_00,values_00);
    local_88[0] = Identifier;
    local_88[1] = LParen;
    local_88[2] = Integer;
    local_88[3] = Div;
    local_88[4] = Integer;
    local_88[5] = RParen;
    local_70.field_1.textValue = "sqrt";
    local_58 = (char *)0x1;
    local_48 = (char *)0x2;
    tokens_01._M_len = 6;
    tokens_01._M_array = local_88;
    values_01._M_len = 3;
    values_01._M_array = &local_70;
    local_70.type = TVar3;
    local_60 = uVar4;
    local_50 = uVar4;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,3,tokens_01,values_01);
    local_88[0] = Identifier;
    local_88[1] = LParen;
    local_88[2] = Float;
    local_88[3] = RParen;
    local_70.field_1.textValue = "sqrt";
    local_60 = 4;
    local_58 = (char *)0x3fe0000000000000;
    tokens_02._M_len = 4;
    tokens_02._M_array = local_88;
    values_02._M_len = 2;
    values_02._M_array = &local_70;
    local_70.type = TVar3;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,3,tokens_02,values_02);
    local_88[0] = Integer;
    local_88[1] = Div;
    local_88[2] = Identifier;
    local_88[3] = LParen;
    local_88[4] = Identifier;
    local_88[5] = RParen;
    local_70.type = Integer;
    local_70.field_1.intValue = 2;
    local_58 = "sqrt";
    local_48 = "pi";
    tokens_03._M_len = 6;
    tokens_03._M_array = local_88;
    values_03._M_len = 3;
    values_03._M_array = &local_70;
    local_60 = TVar3;
    local_50 = TVar3;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,4,tokens_03,values_03);
    local_88[0] = Integer;
    local_88[1] = Div;
    local_88[2] = 1;
    local_70.field_1.intValue = 2;
    local_58 = "pi";
    tokens_04._M_len = 3;
    tokens_04._M_array = local_88;
    values_04._M_len = 2;
    values_04._M_array = &local_70;
    local_70.type = Integer;
    local_60 = TVar3;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,5,tokens_04,values_04);
    local_88[0] = Integer;
    local_88[1] = Div;
    TVar3 = Identifier;
    local_70.field_1.intValue = 1;
    local_58 = "pi";
    tokens_05._M_len = 3;
    tokens_05._M_array = local_88;
    values_05._M_len = 2;
    values_05._M_array = &local_70;
    local_70.type = Integer;
    local_60 = TVar3;
    local_88[2] = TVar3;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,6,tokens_05,values_05);
    local_88[0] = Identifier;
    local_88[1] = Div;
    local_60 = 2;
    local_70.field_1.textValue = "pi";
    local_58 = (char *)0x4;
    tokens_06._M_len = 3;
    tokens_06._M_array = local_88;
    values_06._M_len = 2;
    values_06._M_array = &local_70;
    local_70.type = TVar3;
    local_88[2] = local_60;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,7,tokens_06,values_06);
    local_88[0] = Identifier;
    local_88[1] = Div;
    local_60 = 2;
    local_70.field_1.textValue = "pi";
    local_58 = (char *)0x2;
    tokens_07._M_len = 3;
    tokens_07._M_array = local_88;
    values_07._M_len = 2;
    values_07._M_array = &local_70;
    local_70.type = TVar3;
    local_88[2] = local_60;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,8,tokens_07,values_07);
    local_88[0] = Identifier;
    local_88[1] = Div;
    local_60 = 2;
    local_88[2] = 2;
    local_70.field_1.textValue = "pi";
    local_58 = (char *)0x6;
    tokens_08._M_len = 3;
    tokens_08._M_array = local_88;
    values_08._M_len = 2;
    values_08._M_array = &local_70;
    local_70.type = TVar3;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0x10,tokens_08,values_08);
    local_88[0] = Identifier;
    local_70.field_1.textValue = "pi";
    tokens_09._M_len = 1;
    tokens_09._M_array = local_88;
    values_09._M_len = 1;
    values_09._M_array = &local_70;
    local_70.type = TVar3;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,9,tokens_09,values_09);
    local_88[0] = 1;
    local_70.field_1.textValue = "e";
    tokens_10._M_len = 1;
    tokens_10._M_array = local_88;
    values_10._M_len = 1;
    values_10._M_array = &local_70;
    local_70.type = TVar3;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,10,tokens_10,values_10);
    local_88[0] = Identifier;
    local_88[1] = LParen;
    local_88[2] = Identifier;
    local_88[3] = RParen;
    local_70.field_1.textValue = "log2";
    local_58 = "e";
    tokens_11._M_len = 4;
    tokens_11._M_array = local_88;
    values_11._M_len = 2;
    values_11._M_array = &local_70;
    local_70.type = TVar3;
    local_60 = TVar3;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0xb,tokens_11,values_11);
    local_88[0] = Identifier;
    local_88[1] = LParen;
    local_88[2] = Identifier;
    local_88[3] = RParen;
    local_70.field_1.textValue = "log10";
    local_58 = "e";
    tokens_12._M_len = 4;
    tokens_12._M_array = local_88;
    values_12._M_len = 2;
    values_12._M_array = &local_70;
    local_70.type = TVar3;
    local_60 = TVar3;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0xc,tokens_12,values_12);
    local_88[0] = Identifier;
    local_88[1] = LParen;
    local_88[2] = Integer;
    local_88[3] = RParen;
    local_70.field_1.textValue = "ln";
    TVar5 = Integer;
    local_58 = (char *)0x2;
    tokens_13._M_len = 4;
    tokens_13._M_array = local_88;
    values_13._M_len = 2;
    values_13._M_array = &local_70;
    local_70.type = TVar3;
    local_60 = TVar5;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0xd,tokens_13,values_13);
    local_88[0] = Identifier;
    local_88[1] = LParen;
    local_88[2] = Integer;
    local_88[3] = RParen;
    local_70.field_1.textValue = "ln";
    local_58 = (char *)0xa;
    tokens_14._M_len = 4;
    tokens_14._M_array = local_88;
    values_14._M_len = 2;
    values_14._M_array = &local_70;
    local_70.type = TVar3;
    local_60 = TVar5;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0xe,tokens_14,values_14);
    local_88[0] = Integer;
    local_88[1] = Mult;
    local_88[2] = 1;
    local_70.field_1.intValue = 2;
    local_58 = "pi";
    tokens_15._M_len = 3;
    tokens_15._M_array = local_88;
    values_15._M_len = 2;
    values_15._M_array = &local_70;
    local_70.type = TVar5;
    local_60 = TVar3;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0xf,tokens_15,values_15);
    local_88[0] = Identifier;
    local_88[1] = LParen;
    local_88[2] = Integer;
    local_88[3] = RParen;
    local_70.field_1.textValue = "log10";
    local_58 = (char *)0x2;
    tokens_16._M_len = 4;
    tokens_16._M_array = local_88;
    values_16._M_len = 2;
    values_16._M_array = &local_70;
    local_70.type = TVar3;
    local_60 = TVar5;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0x11,tokens_16,values_16);
    local_88[0] = Identifier;
    local_88[1] = LParen;
    local_88[2] = Integer;
    local_88[3] = RParen;
    local_70.field_1.textValue = "log2";
    local_58 = (char *)0xa;
    tokens_17._M_len = 4;
    tokens_17._M_array = local_88;
    values_17._M_len = 2;
    values_17._M_array = &local_70;
    local_70.type = TVar3;
    local_60 = TVar5;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0x12,tokens_17,values_17);
    result = local_38;
    parser = local_40;
    local_88[0] = Identifier;
    local_88[1] = LParen;
    local_88[2] = Integer;
    local_88[3] = RParen;
    local_88[4] = Div;
    local_88[5] = Integer;
    local_70.field_1.textValue = "sqrt";
    local_58 = (char *)0x3;
    local_48 = (char *)0x2;
    tokens_18._M_len = 6;
    tokens_18._M_array = local_88;
    values_18._M_len = 3;
    values_18._M_array = &local_70;
    local_70.type = TVar3;
    local_60 = TVar5;
    local_50 = TVar5;
    TokenSequenceParser::addEntry(&parseVcstParameter::sequenceParser,0x13,tokens_18,values_18);
  }
  bVar1 = TokenSequenceParser::parse(&parseVcstParameter::sequenceParser,parser,result);
  return bVar1;
}

Assistant:

bool MipsParser::parseVcstParameter(Parser& parser, int& result)
{
	static TokenSequenceParser sequenceParser;

	// initialize on first use
	if (sequenceParser.getEntryCount() == 0)
	{
		// maxfloat
		sequenceParser.addEntry(1,
			{TokenType::Identifier},
			{"maxfloat"}
		);
		// sqrt(2)
		sequenceParser.addEntry(2,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen},
			{"sqrt", INT64_C(2)}
		);
		// sqrt(1/2)
		sequenceParser.addEntry(3,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::Div, TokenType::Integer, TokenType::RParen},
			{"sqrt", INT64_C(1), INT64_C(2)}
		);
		// sqrt(0.5)
		sequenceParser.addEntry(3,
			{TokenType::Identifier, TokenType::LParen, TokenType::Float, TokenType::RParen},
			{"sqrt", 0.5}
		);
		// 2/sqrt(pi)
		sequenceParser.addEntry(4,
			{TokenType::Integer, TokenType::Div, TokenType::Identifier, TokenType::LParen, TokenType::Identifier, TokenType::RParen},
			{INT64_C(2), "sqrt", "pi"}
		);
		// 2/pi
		sequenceParser.addEntry(5,
			{TokenType::Integer, TokenType::Div, TokenType::Identifier},
			{INT64_C(2), "pi"}
		);
		// 1/pi
		sequenceParser.addEntry(6,
			{TokenType::Integer, TokenType::Div, TokenType::Identifier},
			{INT64_C(1), "pi"}
		);
		// pi/4
		sequenceParser.addEntry(7,
			{TokenType::Identifier, TokenType::Div, TokenType::Integer},
			{"pi", INT64_C(4)}
		);
		// pi/2
		sequenceParser.addEntry(8,
			{TokenType::Identifier, TokenType::Div, TokenType::Integer},
			{"pi", INT64_C(2)}
		);
		// pi/6 - early because "pi" is a prefix of it
		sequenceParser.addEntry(16,
			{TokenType::Identifier, TokenType::Div, TokenType::Integer},
			{"pi", INT64_C(6)}
		);
		// pi
		sequenceParser.addEntry(9,
			{TokenType::Identifier},
			{"pi"}
		);
		// e
		sequenceParser.addEntry(10,
			{TokenType::Identifier},
			{"e"}
		);
		// log2(e)
		sequenceParser.addEntry(11,
			{TokenType::Identifier, TokenType::LParen, TokenType::Identifier, TokenType::RParen},
			{"log2", "e"}
		);
		// log10(e)
		sequenceParser.addEntry(12,
			{TokenType::Identifier, TokenType::LParen, TokenType::Identifier, TokenType::RParen},
			{"log10", "e"}
		);
		// ln(2)
		sequenceParser.addEntry(13,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen},
			{"ln", INT64_C(2)}
		);
		// ln(10)
		sequenceParser.addEntry(14,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen},
			{"ln", INT64_C(10)}
		);
		// 2*pi
		sequenceParser.addEntry(15,
			{TokenType::Integer, TokenType::Mult, TokenType::Identifier},
			{INT64_C(2), "pi"}
		);
		// log10(2)
		sequenceParser.addEntry(17,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen},
			{"log10", INT64_C(2)}
		);
		// log2(10)
		sequenceParser.addEntry(18,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen},
			{"log2", INT64_C(10)}
		);
		// sqrt(3)/2
		sequenceParser.addEntry(19,
			{TokenType::Identifier, TokenType::LParen, TokenType::Integer, TokenType::RParen, TokenType::Div, TokenType::Integer},
			{"sqrt", INT64_C(3), INT64_C(2)}
		);
	}

	return sequenceParser.parse(parser,result);
}